

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_himawari8.cc
# Opt level: O2

timespec __thiscall Himawari8ImageHandler::getTime(Himawari8ImageHandler *this,File *f)

{
  char *__s;
  char *pcVar1;
  ulong uVar2;
  timespec tVar3;
  string text;
  tm tm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_28;
  
  lrit::File::getHeader<lrit::AnnotationHeader>((AnnotationHeader *)&tm,f);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  if ((int *)tm._8_8_ == &tm.tm_wday) {
    text.field_2._8_8_ = tm._32_8_;
  }
  else {
    text._M_dataplus._M_p = (pointer)tm._8_8_;
  }
  text._M_string_length._0_4_ = tm.tm_mon;
  text._M_string_length._4_4_ = tm.tm_year;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  tm._24_8_ = tm._24_8_ & 0xffffffffffffff00;
  tm._8_8_ = &tm.tm_wday;
  std::__cxx11::string::~string((string *)&tm.tm_hour);
  std::__cxx11::string::string((string *)&local_28,(string *)&text);
  util::split(&parts,&local_28,'_');
  std::__cxx11::string::~string((string *)&local_28);
  if ((long)parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    __s = parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    tm.tm_isdst = 0;
    tm._36_4_ = 0;
    tm.tm_gmtoff = 0;
    tm.tm_mon = 0;
    tm.tm_year = 0;
    tm.tm_wday = 0;
    tm.tm_yday = 0;
    tm.tm_sec = 0;
    tm.tm_min = 0;
    tm.tm_hour = 0;
    tm.tm_mday = 0;
    tm.tm_zone = (char *)0x0;
    pcVar1 = strptime(__s,"%Y%m%d%H%M",(tm *)&tm);
    if (pcVar1 == __s + 0xc) {
      uVar2 = mktime((tm *)&tm);
      goto LAB_0018d639;
    }
  }
  uVar2 = 0;
LAB_0018d639:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  std::__cxx11::string::~string((string *)&text);
  tVar3.tv_nsec = 0;
  tVar3.tv_sec = uVar2;
  return tVar3;
}

Assistant:

struct timespec Himawari8ImageHandler::getTime(const lrit::File& f) const {
  struct timespec time = {0, 0};

  // Time of Himawari images is encoded in filename.
  // The LRIT time stamp header is bogus.
  // Example annotation: IMG_DK01VIS_201712162250_003.lrit
  auto text = f.getHeader<lrit::AnnotationHeader>().text;
  auto parts = split(text, '_');
  if (parts.size() != 4) {
    return time;
  }

  const char* buf = parts[2].c_str();
  const char* format = "%Y%m%d%H%M";
  struct tm tm;
  memset(&tm, 0, sizeof(tm));
  auto ptr = strptime(buf, format, &tm);

  // Only use time if strptime was successful
  if (ptr == (buf + 12)) {
    time.tv_sec = mktime(&tm);
    time.tv_nsec = 0;
  }

  return time;
}